

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Statement * __thiscall SQCompilation::SQParser::parseStatement(SQParser *this,bool closeframe)

{
  long lVar1;
  SQUnsignedInteger SVar2;
  bool bVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  Node *from;
  ExprStatement *to;
  byte in_SIL;
  SQParser *in_RDI;
  Expr *e_1;
  Expr *e;
  SQUnsignedInteger savedLangFeatures;
  Expr *arg;
  SQInteger ce;
  SQInteger le;
  SQOpcode op;
  SQInteger c;
  SQInteger l;
  Statement *result;
  NestingChecker nc;
  SQParser *in_stack_fffffffffffffe38;
  NestingChecker *in_stack_fffffffffffffe40;
  ContinueStatement *in_stack_fffffffffffffe48;
  SQParser *in_stack_fffffffffffffe50;
  Node *in_stack_fffffffffffffe58;
  SQParser *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe78;
  undefined1 assignable;
  SQParser *in_stack_fffffffffffffe80;
  SQParser *in_stack_fffffffffffffe88;
  SQParser *in_stack_fffffffffffffe90;
  SQParser *in_stack_fffffffffffffeb0;
  SQParser *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined1 global;
  SQParser *in_stack_fffffffffffffed0;
  SQParser *in_stack_fffffffffffffee0;
  SwitchStatement *local_118;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined8 in_stack_ffffffffffffff08;
  SQExpressionContext expression_context;
  SQParser *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 global_00;
  SQParser *in_stack_ffffffffffffff20;
  Expr *local_70;
  int local_68;
  int local_60;
  int local_54;
  int local_50;
  SQParser *in_stack_ffffffffffffffc0;
  int local_38;
  SwitchStatement *local_30;
  NestingChecker local_28;
  byte local_11;
  SQParser *in_stack_fffffffffffffff8;
  
  expression_context = (SQExpressionContext)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  global_00 = (undefined1)((ulong)in_stack_ffffffffffffff18 >> 0x38);
  global = (undefined1)((ulong)in_stack_fffffffffffffec8 >> 0x38);
  assignable = (undefined1)((ulong)in_stack_fffffffffffffe78 >> 0x38);
  local_11 = in_SIL & 1;
  NestingChecker::NestingChecker(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_30 = (SwitchStatement *)0x0;
  SVar4 = line(in_RDI);
  SVar5 = column(in_RDI);
  lVar1 = in_RDI->_token;
  if (lVar1 == 0x3b) {
    local_30 = (SwitchStatement *)newNode<SQCompilation::EmptyStatement>(in_stack_fffffffffffffe50);
    Lex(in_stack_fffffffffffffe50);
  }
  else if (lVar1 == 0x7b) {
    SVar2 = in_RDI->_lang_features;
    Lex(in_stack_fffffffffffffe50);
    local_30 = (SwitchStatement *)parseStatements(in_stack_fffffffffffffe90);
    Expect(in_stack_fffffffffffffe90,(SQInteger)in_stack_fffffffffffffe88);
    in_RDI->_lang_features = SVar2;
  }
  else if (lVar1 == 0x10c) {
    local_30 = parseSwitchStatement(in_stack_fffffffffffffee0);
  }
  else if (lVar1 == 0x110) {
    local_30 = (SwitchStatement *)parseIfStatement(in_stack_ffffffffffffff20);
  }
  else if (lVar1 == 0x112) {
    local_30 = (SwitchStatement *)parseWhileStatement(in_stack_fffffffffffffed0);
  }
  else {
    if (lVar1 == 0x113) {
      newNode<SQCompilation::BreakStatement,decltype(nullptr)>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      local_30 = (SwitchStatement *)
                 setCoordinates<SQCompilation::BreakStatement>
                           (in_stack_fffffffffffffe50,(BreakStatement *)in_stack_fffffffffffffe48,
                            (SQInteger)in_stack_fffffffffffffe40,
                            (SQInteger)in_stack_fffffffffffffe38);
      Lex(in_stack_fffffffffffffe50);
      goto LAB_001b5cf9;
    }
    if (lVar1 == 0x114) {
      local_30 = (SwitchStatement *)
                 parseForStatement((SQParser *)
                                   CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    }
    else if (lVar1 == 0x115) {
      local_30 = (SwitchStatement *)parseDoWhileStatement(in_stack_fffffffffffffeb0);
    }
    else if (lVar1 == 0x117) {
      local_30 = (SwitchStatement *)parseForEachStatement(in_stack_ffffffffffffffc0);
    }
    else if (lVar1 == 0x11b) {
LAB_001b5682:
      local_30 = (SwitchStatement *)parseLocalDeclStatement(in_stack_fffffffffffffff8);
    }
    else {
      if (lVar1 != 0x11d) {
        local_38 = (int)SVar4;
        local_50 = (int)SVar5;
        if (lVar1 != 0x11e) {
          if (lVar1 == 0x123) {
            newNode<SQCompilation::ContinueStatement,decltype(nullptr)>
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
            local_30 = (SwitchStatement *)
                       setCoordinates<SQCompilation::ContinueStatement>
                                 (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                                  (SQInteger)in_stack_fffffffffffffe40,
                                  (SQInteger)in_stack_fffffffffffffe38);
            Lex(in_stack_fffffffffffffe50);
            goto LAB_001b5cf9;
          }
          if (lVar1 != 0x124) {
            if (lVar1 == 0x125) {
              local_30 = (SwitchStatement *)parseTryCatchStatement(in_stack_fffffffffffffec0);
            }
            else {
              if (lVar1 == 0x127) {
                Lex(in_stack_fffffffffffffe50);
                Expression(in_stack_ffffffffffffff10,expression_context);
                newNode<SQCompilation::ThrowStatement,SQCompilation::Expr*>
                          (in_stack_fffffffffffffe60,(Expr *)in_stack_fffffffffffffe58);
                local_30 = (SwitchStatement *)
                           copyCoordinates<SQCompilation::ThrowStatement>
                                     (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                                      (ThrowStatement *)in_stack_fffffffffffffe50);
                Node::setLineStartPos((Node *)local_30,local_38);
                Node::setColumnStartPos((Node *)local_30,local_50);
                goto LAB_001b5cf9;
              }
              if (lVar1 == 0x133) {
                local_30 = (SwitchStatement *)
                           parseLocalClassDeclStmt(in_stack_fffffffffffffe80,(bool)assignable);
              }
              else if (lVar1 == 0x143) {
                local_30 = (SwitchStatement *)
                           parseEnumStatement(in_stack_ffffffffffffff20,(bool)global_00);
              }
              else if (lVar1 == 0x144) {
                local_30 = (SwitchStatement *)
                           parseConstStatement(in_stack_fffffffffffffed0,(bool)global);
              }
              else if (lVar1 == 0x14b) {
                Lex(in_stack_fffffffffffffe50);
                if (in_RDI->_token == 0x144) {
                  local_30 = (SwitchStatement *)
                             parseConstStatement(in_stack_fffffffffffffed0,(bool)global);
                }
                else if (in_RDI->_token == 0x143) {
                  local_30 = (SwitchStatement *)
                             parseEnumStatement(in_stack_ffffffffffffff20,(bool)global_00);
                }
                else {
                  reportDiagnostic(in_RDI,0x17);
                }
              }
              else {
                if (lVar1 != 0x14c) {
                  if (lVar1 != 0x150) {
                    from = &Expression(in_stack_ffffffffffffff10,expression_context)->super_Node;
                    to = newNode<SQCompilation::ExprStatement,SQCompilation::Expr*>
                                   (in_stack_fffffffffffffe60,(Expr *)from);
                    local_30 = (SwitchStatement *)
                               copyCoordinates<SQCompilation::ExprStatement>
                                         (in_stack_fffffffffffffe60,from,to);
                    goto LAB_001b5cf9;
                  }
                  goto LAB_001b5682;
                }
                local_30 = (SwitchStatement *)parseDirectiveStatement(in_stack_fffffffffffffe88);
              }
            }
            goto LAB_001b5cb7;
          }
        }
        if (in_RDI->_token == 0x11e) {
          local_54 = 0x1d;
        }
        else {
          local_54 = 0x3b;
        }
        SVar4 = (in_RDI->_lex)._currentline;
        SVar5 = (in_RDI->_lex)._currentcolumn;
        Lex(in_stack_fffffffffffffe50);
        local_70 = (Expr *)0x0;
        bVar3 = IsEndOfStatement(in_RDI);
        if (!bVar3) {
          local_70 = Expression(in_stack_ffffffffffffff10,expression_context);
        }
        if (local_54 == 0x1d) {
          local_118 = (SwitchStatement *)
                      newNode<SQCompilation::ReturnStatement,SQCompilation::Expr*>
                                (in_stack_fffffffffffffe60,(Expr *)in_stack_fffffffffffffe58);
        }
        else {
          local_118 = (SwitchStatement *)
                      newNode<SQCompilation::YieldStatement,SQCompilation::Expr*>
                                (in_stack_fffffffffffffe60,(Expr *)in_stack_fffffffffffffe58);
        }
        if (local_70 == (Expr *)0x0) {
          local_60 = (int)SVar4;
          Node::setLineEndPos((Node *)local_118,local_60);
          local_68 = (int)SVar5;
          Node::setColumnEndPos((Node *)local_118,local_68);
        }
        else {
          copyCoordinates<SQCompilation::Statement>
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                     (Statement *)in_stack_fffffffffffffe50);
        }
        Node::setLineStartPos((Node *)local_118,local_38);
        Node::setColumnStartPos((Node *)local_118,local_50);
        local_30 = local_118;
        goto LAB_001b5cf9;
      }
      local_30 = (SwitchStatement *)
                 parseLocalFunctionDeclStmt(in_stack_fffffffffffffe80,(bool)assignable);
    }
  }
LAB_001b5cb7:
  setCoordinates<SQCompilation::Statement>
            (in_stack_fffffffffffffe50,(Statement *)in_stack_fffffffffffffe48,
             (SQInteger)in_stack_fffffffffffffe40,(SQInteger)in_stack_fffffffffffffe38);
LAB_001b5cf9:
  NestingChecker::~NestingChecker(&local_28);
  return &local_30->super_Statement;
}

Assistant:

Statement* SQParser::parseStatement(bool closeframe)
{
    NestingChecker nc(this);
    Statement *result = NULL;
    SQInteger l = line(), c = column();

    switch(_token) {
    case _SC(';'):  result = newNode<EmptyStatement>(); Lex(); break;
    case TK_DIRECTIVE:  result = parseDirectiveStatement();    break;
    case TK_IF:     result = parseIfStatement();          break;
    case TK_WHILE:  result = parseWhileStatement();       break;
    case TK_DO:     result = parseDoWhileStatement();     break;
    case TK_FOR:    result = parseForStatement();         break;
    case TK_FOREACH:result = parseForEachStatement();     break;
    case TK_SWITCH: result = parseSwitchStatement();      break;
    case TK_LOCAL:
    case TK_LET:
        result = parseLocalDeclStatement();
        break;
    case TK_RETURN:
    case TK_YIELD: {
        SQOpcode op;
        if(_token == TK_RETURN) {
            op = _OP_RETURN;
        }
        else {
            op = _OP_YIELD;
        }
        SQInteger le = _lex._currentline;
        SQInteger ce = _lex._currentcolumn;
        Lex();

        Expr *arg = NULL;
        if(!IsEndOfStatement()) {
            arg = Expression(SQE_RVALUE);
        }

        result = op == _OP_RETURN ? static_cast<TerminateStatement *>(newNode<ReturnStatement>(arg)) : newNode<YieldStatement>(arg);
        if (arg) {
            copyCoordinates(arg, result);
        }
        else {
            result->setLineEndPos(le);
            result->setColumnEndPos(ce);
        }

        result->setLineStartPos(l);
        result->setColumnStartPos(c);

        return result;
    }
    case TK_BREAK:
        result = setCoordinates(newNode<BreakStatement>(nullptr), l, c);
        Lex();
        return result;
    case TK_CONTINUE:
        result = setCoordinates(newNode<ContinueStatement>(nullptr), l, c);
        Lex();
        return result;
    case TK_FUNCTION:
        result = parseLocalFunctionDeclStmt(false);
        break;
    case TK_CLASS:
        result = parseLocalClassDeclStmt(false);
        break;
    case TK_ENUM:
        result = parseEnumStatement(false);
        break;
    case _SC('{'):
    {
        SQUnsignedInteger savedLangFeatures = _lang_features;
        Lex();
        result = parseStatements();
        Expect(_SC('}'));
        _lang_features = savedLangFeatures;
        break;
    }
    case TK_TRY:
        result = parseTryCatchStatement();
        break;
    case TK_THROW: {
        Lex();
        Expr *e = Expression(SQE_RVALUE);
        result = copyCoordinates(e, newNode<ThrowStatement>(e));
        result->setLineStartPos(l); result->setColumnStartPos(c);
        return result;
    }
    case TK_CONST:
        result = parseConstStatement(false);
        break;
    case TK_GLOBAL:
        Lex();
        if (_token == TK_CONST)
            result = parseConstStatement(true);
        else if (_token == TK_ENUM)
            result = parseEnumStatement(true);
        else
            reportDiagnostic(DiagnosticsId::DI_GLOBAL_CONSTS_ONLY);
        break;
    default: {
        Expr *e = Expression(SQE_REGULAR);
        return copyCoordinates(e, newNode<ExprStatement>(e));
      }
    }

    setCoordinates(result, l, c);

    assert(result);
    return result;
}